

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CDict *
ZSTD_createCDict_advanced2
          (void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_CCtx_params *originalCctxParams,
          ZSTD_customMem customMem)

{
  size_t sVar1;
  uint uVar2;
  ZSTD_cwksp *pZVar3;
  ZSTD_CCtx_params *pZVar4;
  ZSTD_cwksp *pZVar5;
  undefined8 *puVar6;
  U32 enableDedicatedDictSearch;
  void *alloc;
  ZSTD_paramSwitch_e useRowMatchFinder;
  long lVar7;
  size_t __size;
  byte bVar8;
  ulong uVar9;
  ZSTD_CDict *pZVar10;
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params in_stack_fffffffffffffd98;
  ZSTD_cwksp local_178;
  ZSTD_CCtx_params local_128;
  ZSTD_compressionParameters local_58;
  
  bVar8 = 0;
  memcpy(&local_128,originalCctxParams,0xd0);
  enableDedicatedDictSearch = local_128.enableDedicatedDictSearch;
  if ((customMem.customFree == (ZSTD_freeFunction)0x0) ==
      (customMem.customAlloc == (ZSTD_allocFunction)0x0)) {
    if (local_128.enableDedicatedDictSearch == 0) {
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)&local_178,&local_128,0xffffffffffffffff,dictSize,
                 ZSTD_cpm_createCDict);
      local_128.cParams.strategy = (ZSTD_strategy)local_178.tableEnd;
      pZVar10 = (ZSTD_CDict *)local_178.objectEnd;
      local_128.cParams.windowLog = (uint)local_178.workspace;
      local_128.cParams.chainLog = local_178.workspace._4_4_;
      local_128.cParams.hashLog = (uint)local_178.workspaceEnd;
      local_128.cParams.searchLog = local_178.workspaceEnd._4_4_;
    }
    else {
      ZSTD_getCParams_internal
                ((ZSTD_compressionParameters *)&local_178,local_128.compressionLevel,0,dictSize,
                 ZSTD_cpm_createCDict);
      uVar2 = (uint)local_178.workspaceEnd + 2;
      if (2 < (ZSTD_strategy)local_178.tableEnd - ZSTD_greedy) {
        uVar2 = (uint)local_178.workspaceEnd;
      }
      local_128.cParams.windowLog =
           ~-(uint)(local_128.cParams.windowLog == 0) & local_128.cParams.windowLog |
           (uint)local_178.workspace & -(uint)(local_128.cParams.windowLog == 0);
      local_128.cParams.chainLog =
           ~-(uint)(local_128.cParams.chainLog == 0) & local_128.cParams.chainLog |
           local_178.workspace._4_4_ & -(uint)(local_128.cParams.chainLog == 0);
      local_128.cParams.hashLog =
           ~-(uint)(local_128.cParams.hashLog == 0) & local_128.cParams.hashLog |
           uVar2 & -(uint)(local_128.cParams.hashLog == 0);
      local_128.cParams.searchLog =
           ~-(uint)(local_128.cParams.searchLog == 0) & local_128.cParams.searchLog |
           local_178.workspaceEnd._4_4_ & -(uint)(local_128.cParams.searchLog == 0);
      uVar9 = CONCAT44(-(uint)(local_128.cParams.targetLength == 0),
                       -(uint)(local_128.cParams.minMatch == 0));
      pZVar10 = (ZSTD_CDict *)
                (~uVar9 & CONCAT44(local_128.cParams.targetLength,local_128.cParams.minMatch) |
                (ulong)local_178.objectEnd & uVar9);
      local_128.cParams.strategy = local_128.cParams.strategy;
      if (local_128.cParams.strategy == 0) {
        local_128.cParams.strategy = (ZSTD_strategy)local_178.tableEnd;
      }
    }
    if (((local_128.cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) ||
        (local_128.cParams.hashLog <= local_128.cParams.chainLog)) ||
       (0x18 < local_128.cParams.chainLog)) {
      local_128.enableDedicatedDictSearch = 0;
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)&local_178,&local_128,0xffffffffffffffff,dictSize,
                 ZSTD_cpm_createCDict);
      enableDedicatedDictSearch = 0;
      pZVar10 = (ZSTD_CDict *)local_178.objectEnd;
      local_128.cParams.strategy = (ZSTD_strategy)local_178.tableEnd;
      local_128.cParams.windowLog = (uint)local_178.workspace;
      local_128.cParams.chainLog = local_178.workspace._4_4_;
      local_128.cParams.hashLog = (uint)local_178.workspaceEnd;
      local_128.cParams.searchLog = local_178.workspaceEnd._4_4_;
    }
    local_128.cParams.minMatch = (uint)pZVar10;
    local_128.cParams.targetLength = (uint)((ulong)pZVar10 >> 0x20);
    useRowMatchFinder = local_128.useRowMatchFinder;
    if ((local_128.useRowMatchFinder == ZSTD_ps_auto) &&
       (useRowMatchFinder = ZSTD_ps_disable, 0xfffffffc < local_128.cParams.strategy - ZSTD_btlazy2)
       ) {
      useRowMatchFinder = (local_128.cParams.windowLog < 0xf) + ZSTD_ps_enable;
    }
    local_58.chainLog = local_128.cParams.chainLog;
    local_58.windowLog = local_128.cParams.windowLog;
    local_58.minMatch = local_128.cParams.minMatch;
    local_58.targetLength = local_128.cParams.targetLength;
    local_128.useRowMatchFinder = useRowMatchFinder;
    local_58.hashLog = local_128.cParams.hashLog;
    local_58.searchLog = local_128.cParams.searchLog;
    local_58.strategy = local_128.cParams.strategy;
    sVar1 = ZSTD_sizeof_matchState(&local_58,useRowMatchFinder,enableDedicatedDictSearch,0);
    lVar7 = (dictSize + 7 & 0xfffffffffffffff8) + 0x39c0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar7 = 0x39c0;
    }
    __size = lVar7 + sVar1;
    if (customMem.customAlloc == (ZSTD_allocFunction)0x0) {
      pZVar10 = (ZSTD_CDict *)malloc(__size);
    }
    else {
      pZVar10 = (ZSTD_CDict *)(*customMem.customAlloc)(customMem.opaque,__size);
    }
    if (pZVar10 != (ZSTD_CDict *)0x0) {
      if (((ulong)pZVar10 & 7) != 0) {
        __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                      ,0x285,
                      "void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t, ZSTD_cwksp_static_alloc_e)"
                     );
      }
      local_178.workspaceEnd = (void *)((long)&pZVar10->dictContent + __size);
      local_178.allocStart = (void *)((ulong)local_178.workspaceEnd & 0xffffffffffffffc0);
      local_178.phase = ZSTD_cwksp_alloc_objects;
      local_178.isStatic = ZSTD_cwksp_dynamic_alloc;
      local_178.allocFailed = '\0';
      local_178.workspace = pZVar10;
      local_178.objectEnd = pZVar10;
      local_178.tableEnd = pZVar10;
      local_178.tableValidEnd = pZVar10;
      local_178.initOnceStart = local_178.allocStart;
      ZSTD_cwksp_assert_internal_consistency(&local_178);
      local_178.workspaceOversizedDuration = 0;
      ZSTD_cwksp_assert_internal_consistency(&local_178);
      ZSTD_cwksp_assert_internal_consistency(&local_178);
      if ((long)__size < 0x17c0) {
        __assert_fail("cdict != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1511,
                      "ZSTD_CDict *ZSTD_createCDict_advanced_internal(size_t, ZSTD_dictLoadMethod_e, ZSTD_compressionParameters, ZSTD_paramSwitch_e, U32, ZSTD_customMem)"
                     );
      }
      local_178.objectEnd = pZVar10 + 1;
      local_178.tableEnd = local_178.objectEnd;
      local_178.tableValidEnd = local_178.objectEnd;
      pZVar3 = &local_178;
      pZVar5 = &pZVar10->workspace;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        pZVar5->workspace = pZVar3->workspace;
        pZVar3 = (ZSTD_cwksp *)((long)pZVar3 + ((ulong)bVar8 * -2 + 1) * 8);
        pZVar5 = (ZSTD_cwksp *)((long)pZVar5 + (ulong)bVar8 * -0x10 + 8);
      }
      (pZVar10->customMem).customAlloc = customMem.customAlloc;
      (pZVar10->customMem).customFree = customMem.customFree;
      (pZVar10->customMem).opaque = customMem.opaque;
      pZVar10->compressionLevel = 0;
      pZVar10->useRowMatchFinder = useRowMatchFinder;
    }
    pZVar4 = &local_128;
    puVar6 = (undefined8 *)&stack0xfffffffffffffd98;
    for (lVar7 = 0x1a; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar6 = *(undefined8 *)pZVar4;
      pZVar4 = (ZSTD_CCtx_params *)((long)pZVar4 + ((ulong)bVar8 * -2 + 1) * 8);
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    }
    sVar1 = ZSTD_initCDict_internal
                      (pZVar10,dict,dictSize,dictLoadMethod,dictContentType,
                       in_stack_fffffffffffffd98);
    if (sVar1 < 0xffffffffffffff89) {
      return pZVar10;
    }
    ZSTD_freeCDict(pZVar10);
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced2(
        const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod,
        ZSTD_dictContentType_e dictContentType,
        const ZSTD_CCtx_params* originalCctxParams,
        ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams = *originalCctxParams;
    ZSTD_compressionParameters cParams;
    ZSTD_CDict* cdict;

    DEBUGLOG(3, "ZSTD_createCDict_advanced2, mode %u", (unsigned)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    if (cctxParams.enableDedicatedDictSearch) {
        cParams = ZSTD_dedicatedDictSearch_getCParams(
            cctxParams.compressionLevel, dictSize);
        ZSTD_overrideCParams(&cParams, &cctxParams.cParams);
    } else {
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    if (!ZSTD_dedicatedDictSearch_isSupported(&cParams)) {
        /* Fall back to non-DDSS params */
        cctxParams.enableDedicatedDictSearch = 0;
        cParams = ZSTD_getCParamsFromCCtxParams(
            &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_createCDict);
    }

    DEBUGLOG(3, "ZSTD_createCDict_advanced2: DDS: %u", cctxParams.enableDedicatedDictSearch);
    cctxParams.cParams = cParams;
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);

    cdict = ZSTD_createCDict_advanced_internal(dictSize,
                        dictLoadMethod, cctxParams.cParams,
                        cctxParams.useRowMatchFinder, cctxParams.enableDedicatedDictSearch,
                        customMem);

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                    dict, dictSize,
                                    dictLoadMethod, dictContentType,
                                    cctxParams) )) {
        ZSTD_freeCDict(cdict);
        return NULL;
    }

    return cdict;
}